

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetailedHelloWorld.cpp
# Opt level: O1

int main(void)

{
  __atomic_base<unsigned_long> _Var1;
  atomic<unsigned_long> eventSourceId;
  cx_string<2UL> cVar2;
  int iVar3;
  size_t sVar4;
  undefined8 uVar5;
  bool bVar6;
  SessionWriter writer;
  Session session;
  ofstream logfile;
  cx_string<1UL> local_40a;
  string local_408;
  undefined1 local_3e8 [16];
  _Alloc_hider local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  _Alloc_hider local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  uint64_t local_378;
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  SessionWriter local_330;
  Session local_300;
  ConsumeResult local_258;
  undefined1 local_238 [8];
  long lStack_230;
  byte abStack_218 [216];
  ios_base local_140 [272];
  
  binlog::Session::Session(&local_300);
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  binlog::SessionWriter::SessionWriter(&local_330,&local_300,0x100000,0,&local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                             local_408.field_2._M_local_buf[0]) + 1);
  }
  if (*(ushort *)((long)local_330._session + 0x88) < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      local_3e8._0_8_ = 0;
      local_3e8._8_2_ = info;
      local_3d8._M_p = (pointer)&local_3c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"main","");
      local_3b8._M_p = (pointer)&local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"main","");
      local_398._M_p = (pointer)&local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_398,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/example/DetailedHelloWorld.cpp"
                 ,"");
      local_378 = 0xd;
      local_370._M_p = (pointer)&local_360;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"Hello {}!","");
      local_258.bytesConsumed._0_2_ = 0x5b;
      local_40a._data[0] = 'c';
      local_40a._data[1] = '\0';
      cVar2 = mserialize::cx_strcat<1ul,1ul>((cx_string<1UL> *)&local_258,&local_40a);
      local_238 = (undefined1  [8])(CONCAT53(local_238._3_5_,cVar2._data) & 0xffffffffff00ffff);
      local_350._M_p = (pointer)&local_340;
      sVar4 = strlen(local_238);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_350,local_238,local_238 + sVar4);
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)local_330._session);
      if (iVar3 != 0) {
        uVar5 = std::__throw_system_error(iVar3);
        pthread_mutex_unlock((pthread_mutex_t *)local_330._session);
        binlog::EventSource::~EventSource((EventSource *)local_3e8);
        if (local_330._channel.
            super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_330._channel.
                     super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        binlog::Session::~Session(&local_300);
        _Unwind_Resume(uVar5);
      }
      local_3e8._0_8_ = ((pthread_mutex_t *)((long)local_330._session + 0x78))->__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_3e8,
                 (RecoverableVectorOutputStream *)((long)local_330._session + 0x58));
      _Var1._M_i = ((pthread_mutex_t *)((long)local_330._session + 0x78))->__align;
      ((pthread_mutex_t *)((long)local_330._session + 0x78))->__align = _Var1._M_i + 1;
      pthread_mutex_unlock((pthread_mutex_t *)local_330._session);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_p != &local_340) {
        operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != &local_360) {
        operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_p != &local_388) {
        operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != &local_3a8) {
        operator_delete(local_3b8._M_p,local_3a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_p != &local_3c8) {
        operator_delete(local_3d8._M_p,local_3c8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var1._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_238 = (undefined1  [8])0x0;
    lStack_230 = 0;
    clock_gettime(0,(timespec *)local_238);
    binlog::SessionWriter::addEvent<char_const(&)[6]>
              (&local_330,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,
               (long)local_238 * 1000000000 + lStack_230,(char (*) [6])"World");
  }
  std::ofstream::ofstream(local_238,"hello.blog",_S_out|_S_bin);
  binlog::Session::consume<std::ofstream>
            (&local_258,&local_300,(basic_ofstream<char,_std::char_traits<char>_> *)local_238);
  bVar6 = (abStack_218[*(long *)((long)local_238 + -0x18)] & 5) == 0;
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Binary log written to hello.blog\n",0x21);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to write hello.blog\n",0x1b);
  }
  local_238 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_238 + *(long *)(_VTT + -0x18)) = _strftime;
  std::filebuf::~filebuf((filebuf *)&lStack_230);
  std::ios_base::~ios_base(local_140);
  if (local_330._channel.super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330._channel.
               super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_300._specialEntryBuffer.vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_300._specialEntryBuffer.vector.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_300._specialEntryBuffer.vector.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_300._specialEntryBuffer.vector.
                                   super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  if (local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_300._sources._vector.super__Vector_base<char,_std::allocator<char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  if (local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_300._clockSync._vector.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_300._clockSync._vector.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_300._clockSync._vector.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::~vector(&local_300._channels);
  return (uint)!bVar6;
}

Assistant:

int main()
{
  binlog::Session session;
  binlog::SessionWriter writer(session);

  BINLOG_INFO_W(writer, "Hello {}!", "World");

  std::ofstream logfile("hello.blog", std::ofstream::out|std::ofstream::binary);
  session.consume(logfile);

  if (! logfile)
  {
    std::cerr << "Failed to write hello.blog\n";
    return 1;
  }

  std::cout << "Binary log written to hello.blog\n";
  return 0;
}